

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Grid_Iterator.h
# Opt level: O3

void __thiscall Nova::Grid_Iterator<float,_3>::Next_Helper(Grid_Iterator<float,_3> *this)

{
  Range<int,_3> *pRVar1;
  TV *pTVar2;
  T_INDEX *pTVar3;
  undefined8 uVar4;
  uint uVar5;
  int iVar6;
  long lVar7;
  bool bVar8;
  
  pRVar1 = &this->region;
  pTVar3 = &this->index;
  (this->index)._data._M_elems[2] = (this->region).min_corner._data._M_elems[2];
  pTVar2 = &(this->region).max_corner;
  uVar5 = 1;
  do {
    iVar6 = (pTVar3->_data)._M_elems[uVar5];
    if (iVar6 < (pTVar2->_data)._M_elems[uVar5]) {
      (pTVar3->_data)._M_elems[uVar5] = iVar6 + 1;
      return;
    }
    (pTVar3->_data)._M_elems[uVar5] = (pRVar1->min_corner)._data._M_elems[uVar5];
    bVar8 = uVar5 != 0;
    uVar5 = uVar5 - 1;
  } while (bVar8);
  lVar7 = (long)this->current_region;
  iVar6 = this->current_region + 1;
  this->valid = iVar6 < this->number_of_regions;
  if (iVar6 < this->number_of_regions) {
    this->current_region = iVar6;
    if (lVar7 * 0x18 != -0x30) {
      uVar4 = *(undefined8 *)this->regions[lVar7 + 1].min_corner._data._M_elems;
      (this->region).min_corner._data._M_elems[2] =
           this->regions[lVar7 + 1].min_corner._data._M_elems[2];
      *(undefined8 *)(pRVar1->min_corner)._data._M_elems = uVar4;
      uVar4 = *(undefined8 *)this->regions[lVar7 + 1].max_corner._data._M_elems;
      (this->region).max_corner._data._M_elems[2] =
           this->regions[lVar7 + 1].max_corner._data._M_elems[2];
      *(undefined8 *)(pTVar2->_data)._M_elems = uVar4;
    }
    (this->index)._data._M_elems[2] = (this->region).min_corner._data._M_elems[2];
    *(undefined8 *)(pTVar3->_data)._M_elems = *(undefined8 *)(pRVar1->min_corner)._data._M_elems;
  }
  return;
}

Assistant:

void Next_Helper()
    {
        index(d-1)=region.min_corner(d-1);
        for(int i=d-2;i>=0;--i)
        {
            if(index(i)<region.max_corner(i)){++index(i);return;}
            index(i)=region.min_corner(i);
        }
        Reset(current_region+1);
    }